

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktRasterizationTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::rasterization::anon_unknown_0::TriangleInterpolationTestInstance::iterate
          (TestStatus *__return_storage_ptr__,TriangleInterpolationTestInstance *this)

{
  undefined8 *puVar1;
  size_type *psVar2;
  undefined8 uVar3;
  deUint32 width;
  VkPrimitiveTopology VVar4;
  TestLog *log;
  bool bVar5;
  int iVar6;
  pointer pVVar7;
  float *pfVar8;
  long lVar9;
  int iVar10;
  int vtxNdx_1;
  ulong uVar11;
  long lVar12;
  long lVar13;
  int vtxNdx;
  float fVar14;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> drawBuffer;
  _Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  local_278;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> colorBuffer;
  Surface resultImage;
  ScopedLogSection section;
  RasterizationArguments local_1fc;
  IVec4 colorBits;
  string iterationDescription;
  undefined1 local_1b8 [8];
  pointer pSStack_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  float local_198 [2];
  undefined1 *puStack_190;
  float local_188 [2];
  float afStack_180 [2];
  float local_178 [2];
  float afStack_170 [2];
  float local_168 [2];
  float afStack_160 [2];
  bool local_158 [296];
  
  local_278._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_278._M_impl.super__Vector_impl_data._M_start._4_4_,
                         this->m_iteration + 1);
  de::toString<int>((string *)&drawBuffer,(int *)&local_278);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&resultImage,
                 "Test iteration ",(string *)&drawBuffer);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&resultImage,
                 " / ");
  de::toString<int>((string *)&colorBuffer,&this->m_iterationCount);
  std::operator+(&iterationDescription,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&colorBuffer);
  std::__cxx11::string::~string((string *)&colorBuffer);
  std::__cxx11::string::~string((string *)local_1b8);
  std::__cxx11::string::~string((string *)&resultImage);
  std::__cxx11::string::~string((string *)&drawBuffer);
  log = ((this->super_BaseRenderingTestInstance).super_TestInstance.m_context)->m_testCtx->m_log;
  drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(drawBuffer.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,this->m_iteration + 1);
  de::toString<int>((string *)&resultImage,(int *)&drawBuffer);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
                 "Iteration",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&resultImage);
  tcu::ScopedLogSection::ScopedLogSection(&section,log,(string *)local_1b8,&iterationDescription);
  std::__cxx11::string::~string((string *)local_1b8);
  std::__cxx11::string::~string((string *)&resultImage);
  width = (this->super_BaseRenderingTestInstance).m_renderSize;
  tcu::Surface::Surface(&resultImage,width,width);
  drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  colorBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_278._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  colorBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  colorBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_278._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_278._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b8 = (undefined1  [8])0x3f800000;
  pSStack_1b0 = (pointer)0x3f80000000000000;
  local_1a8._M_allocated_capacity = 0x3f80000000000000;
  local_1a8._8_8_ = 0x3f80000000000000;
  local_198[0] = 0.0;
  local_198[1] = 0.0;
  puStack_190 = &DAT_3f8000003f800000;
  deRandom_init((deRandom *)&local_1fc,this->m_iteration * 1000 + this->m_primitiveTopology + 0x7b);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize(&drawBuffer,6)
  ;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
            (&colorBuffer,6);
  lVar13 = 0;
  uVar11 = 0;
  while( true ) {
    if ((long)(int)((ulong)((long)drawBuffer.
                                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)drawBuffer.
                                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 4) <= (long)uVar11)
    break;
    fVar14 = deRandom_getFloat((deRandom *)&local_1fc);
    *(float *)((long)(drawBuffer.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar13) =
         fVar14 * 1.8 + -0.9;
    fVar14 = deRandom_getFloat((deRandom *)&local_1fc);
    *(float *)((long)(drawBuffer.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar13 + 4) =
         fVar14 * 1.8 + -0.9;
    *(undefined4 *)
     ((long)(drawBuffer.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start)->m_data + lVar13 + 8) = 0;
    fVar14 = 1.0;
    if (this->m_projective == true) {
      fVar14 = deRandom_getFloat((deRandom *)&local_1fc);
      fVar14 = fVar14 * 3.8 + 0.2;
      uVar3 = *(undefined8 *)
               ((long)(drawBuffer.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar13);
      *(ulong *)((long)(drawBuffer.
                        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar13) =
           CONCAT44(fVar14 * (float)((ulong)uVar3 >> 0x20),fVar14 * (float)uVar3);
      *(float *)((long)(drawBuffer.
                        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar13 + 8) =
           *(float *)((long)(drawBuffer.
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar13 + 8) *
           fVar14;
    }
    *(float *)((long)(drawBuffer.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar13 + 0xc) = fVar14;
    uVar3 = *(undefined8 *)((long)(local_1b8 + lVar13 + (uVar11 / 3) * -0x30) + 8);
    puVar1 = (undefined8 *)
             ((long)(colorBuffer.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar13);
    *puVar1 = *(undefined8 *)(local_1b8 + lVar13 + (uVar11 / 3) * -0x30);
    puVar1[1] = uVar3;
    uVar11 = uVar11 + 1;
    lVar13 = lVar13 + 0x10;
  }
  VVar4 = this->m_primitiveTopology;
  if (VVar4 == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST) {
    for (iVar6 = 2; iVar10 = iVar6 + -2,
        iVar10 < (int)((ulong)((long)drawBuffer.
                                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)drawBuffer.
                                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 4) + -2;
        iVar6 = iVar6 + 3) {
      tcu::TriangleSceneSpec::SceneTriangle::SceneTriangle((SceneTriangle *)local_1b8);
      local_1b8 = *(undefined1 (*) [8])
                   drawBuffer.
                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[iVar10].m_data;
      pSStack_1b0 = *(pointer *)
                     (drawBuffer.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[iVar10].m_data + 2);
      local_1a8._M_allocated_capacity =
           *(undefined8 *)
            drawBuffer.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start[iVar6 + -1].m_data;
      local_1a8._8_8_ =
           *(undefined8 *)
            (drawBuffer.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start[iVar6 + -1].m_data + 2);
      local_198 = *(float (*) [2])
                   drawBuffer.
                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[iVar6].m_data;
      puStack_190 = *(undefined1 **)
                     (drawBuffer.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[iVar6].m_data + 2);
      local_158[0] = false;
      local_158[1] = false;
      local_158[2] = false;
      local_188 = *(float (*) [2])
                   colorBuffer.
                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[iVar10].m_data;
      afStack_180 = *(float (*) [2])
                     (colorBuffer.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[iVar10].m_data + 2);
      if (this->m_flatshade == 0) {
        local_178 = *(float (*) [2])
                     colorBuffer.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[iVar6 + -1].m_data;
        afStack_170 = *(float (*) [2])
                       (colorBuffer.
                        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[iVar6 + -1].m_data + 2);
        pVVar7 = colorBuffer.
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_start + iVar6;
      }
      else {
        pVVar7 = colorBuffer.
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_start + iVar10;
        local_178 = *(float (*) [2])pVVar7->m_data;
        afStack_170 = *(float (*) [2])(pVVar7->m_data + 2);
      }
      local_168 = *(float (*) [2])pVVar7->m_data;
      afStack_160 = *(float (*) [2])(pVVar7->m_data + 2);
      std::
      vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ::push_back((vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                   *)&local_278,(SceneTriangle *)local_1b8);
    }
  }
  else if (VVar4 == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP) {
    lVar13 = 0x200000000;
    lVar12 = 0;
    for (lVar9 = 0;
        lVar9 < ((long)drawBuffer.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)drawBuffer.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start) * 0x10000000 + -0x200000000 >> 0x20
        ; lVar9 = lVar9 + 1) {
      tcu::TriangleSceneSpec::SceneTriangle::SceneTriangle((SceneTriangle *)local_1b8);
      puVar1 = (undefined8 *)
               ((long)(drawBuffer.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar12);
      local_1b8 = (undefined1  [8])*puVar1;
      pSStack_1b0 = (pointer)puVar1[1];
      psVar2 = (size_type *)
               ((long)drawBuffer.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[1].m_data + lVar12);
      local_1a8._M_allocated_capacity = *psVar2;
      local_1a8._8_8_ = psVar2[1];
      pfVar8 = (float *)((long)(drawBuffer.
                                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_data +
                        (lVar13 >> 0x1c));
      local_198 = *(float (*) [2])pfVar8;
      puStack_190 = *(undefined1 **)(pfVar8 + 2);
      local_158[0] = false;
      local_158[1] = false;
      local_158[2] = false;
      pfVar8 = (float *)((long)(colorBuffer.
                                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar12);
      local_188 = *(float (*) [2])pfVar8;
      afStack_180 = *(float (*) [2])(pfVar8 + 2);
      if (this->m_flatshade == 0) {
        pfVar8 = (float *)((long)colorBuffer.
                                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[1].m_data + lVar12);
        local_178 = *(float (*) [2])pfVar8;
        afStack_170 = *(float (*) [2])(pfVar8 + 2);
        pVVar7 = colorBuffer.
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_start + (lVar13 >> 0x20);
      }
      else {
        pVVar7 = (pointer)((long)(colorBuffer.
                                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar12);
        local_178 = *(float (*) [2])pVVar7->m_data;
        afStack_170 = *(float (*) [2])(pVVar7->m_data + 2);
      }
      local_168 = *(float (*) [2])pVVar7->m_data;
      afStack_160 = *(float (*) [2])(pVVar7->m_data + 2);
      std::
      vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ::push_back((vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                   *)&local_278,(SceneTriangle *)local_1b8);
      lVar13 = lVar13 + 0x100000000;
      lVar12 = lVar12 + 0x10;
    }
  }
  else if (VVar4 == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_FAN) {
    lVar13 = 1;
    lVar12 = 0x10;
    while (lVar13 < ((long)drawBuffer.
                           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)drawBuffer.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) * 0x10000000 + -0x100000000 >>
                    0x20) {
      tcu::TriangleSceneSpec::SceneTriangle::SceneTriangle((SceneTriangle *)local_1b8);
      local_1b8 = *(undefined1 (*) [8])
                   (drawBuffer.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->m_data;
      pSStack_1b0 = *(pointer *)
                     ((drawBuffer.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->m_data + 2);
      psVar2 = (size_type *)
               ((long)(drawBuffer.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar12);
      local_1a8._M_allocated_capacity = *psVar2;
      local_1a8._8_8_ = psVar2[1];
      lVar13 = lVar13 + 1;
      pfVar8 = (float *)((long)drawBuffer.
                               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[1].m_data + lVar12);
      local_198 = *(float (*) [2])pfVar8;
      puStack_190 = *(undefined1 **)(pfVar8 + 2);
      local_158[0] = false;
      local_158[1] = false;
      local_158[2] = false;
      if (this->m_flatshade == 0) {
        local_188 = *(float (*) [2])
                     (colorBuffer.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->m_data;
        afStack_180 = *(float (*) [2])
                       ((colorBuffer.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->m_data + 2);
        pfVar8 = (float *)((long)(colorBuffer.
                                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar12);
        local_178 = *(float (*) [2])pfVar8;
        afStack_170 = *(float (*) [2])(pfVar8 + 2);
        lVar9 = lVar13 * 0x10;
      }
      else {
        pfVar8 = (float *)((long)(colorBuffer.
                                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar12);
        local_188 = *(float (*) [2])pfVar8;
        afStack_180 = *(float (*) [2])(pfVar8 + 2);
        pfVar8 = (float *)((long)(colorBuffer.
                                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar12);
        local_178 = *(float (*) [2])pfVar8;
        afStack_170 = *(float (*) [2])(pfVar8 + 2);
        lVar9 = lVar12;
      }
      pfVar8 = (float *)((long)(colorBuffer.
                                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar9);
      local_168 = *(float (*) [2])pfVar8;
      afStack_160 = *(float (*) [2])(pfVar8 + 2);
      std::
      vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ::push_back((vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                   *)&local_278,(SceneTriangle *)local_1b8);
      lVar12 = lVar12 + 0x10;
    }
  }
  local_1b8 = (undefined1  [8])
              ((this->super_BaseRenderingTestInstance).super_TestInstance.m_context)->m_testCtx->
              m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pSStack_1b0);
  std::operator<<((ostream *)&pSStack_1b0,"Generated vertices:");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pSStack_1b0);
  lVar12 = 0;
  for (lVar13 = 0;
      lVar13 < (int)((ulong)((long)drawBuffer.
                                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)drawBuffer.
                                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 4);
      lVar13 = lVar13 + 1) {
    local_1b8 = (undefined1  [8])
                ((this->super_BaseRenderingTestInstance).super_TestInstance.m_context)->m_testCtx->
                m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pSStack_1b0);
    std::operator<<((ostream *)&pSStack_1b0,"\t");
    tcu::operator<<((ostream *)&pSStack_1b0,
                    (Vector<float,_4> *)
                    ((long)(drawBuffer.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar12));
    std::operator<<((ostream *)&pSStack_1b0,",\tcolor= ");
    tcu::operator<<((ostream *)&pSStack_1b0,
                    (Vector<float,_4> *)
                    ((long)(colorBuffer.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar12));
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pSStack_1b0);
    lVar12 = lVar12 + 0x10;
  }
  BaseRenderingTestInstance::drawPrimitives
            (&this->super_BaseRenderingTestInstance,&resultImage,&drawBuffer,&colorBuffer,
             this->m_primitiveTopology);
  local_1b8 = (undefined1  [8])0x0;
  pSStack_1b0 = (pointer)0x0;
  local_1a8._M_allocated_capacity = 0;
  tcu::getTextureFormatBitDepth
            ((tcu *)&colorBits,&(this->super_BaseRenderingTestInstance).m_textureFormat);
  local_1fc.numSamples = (int)((this->super_BaseRenderingTestInstance).m_multisampling != 0);
  local_1fc.subpixelBits = (this->super_BaseRenderingTestInstance).m_subpixelBits;
  local_1fc.redBits = colorBits.m_data[0];
  local_1fc.greenBits = colorBits.m_data[1];
  local_1fc.blueBits = colorBits.m_data[2];
  local_1b8 = (undefined1  [8])local_278._M_impl.super__Vector_impl_data._M_start;
  pSStack_1b0 = local_278._M_impl.super__Vector_impl_data._M_finish;
  local_1a8._M_allocated_capacity =
       (size_type)local_278._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_278._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_278._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_278._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  bVar5 = tcu::verifyTriangleGroupInterpolation
                    (&resultImage,(TriangleSceneSpec *)local_1b8,&local_1fc,
                     ((this->super_BaseRenderingTestInstance).super_TestInstance.m_context)->
                     m_testCtx->m_log);
  if (!bVar5) {
    this->m_allIterationsPassed = false;
  }
  std::
  _Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  ::~_Vector_base((_Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                   *)local_1b8);
  iVar6 = this->m_iteration + 1;
  this->m_iteration = iVar6;
  if (iVar6 == this->m_iterationCount) {
    if (this->m_allIterationsPassed == true) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1b8,"Pass",(allocator<char> *)&local_1fc);
      tcu::TestStatus::pass(__return_storage_ptr__,(string *)local_1b8);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1b8,"Found invalid pixel values",(allocator<char> *)&local_1fc);
      tcu::TestStatus::fail(__return_storage_ptr__,(string *)local_1b8);
    }
    std::__cxx11::string::~string((string *)local_1b8);
  }
  else {
    tcu::TestStatus::incomplete();
  }
  std::
  _Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  ::~_Vector_base(&local_278);
  std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
            (&colorBuffer.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>);
  std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
            (&drawBuffer.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>);
  tcu::Surface::~Surface(&resultImage);
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  std::__cxx11::string::~string((string *)&iterationDescription);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus TriangleInterpolationTestInstance::iterate (void)
{
	const std::string								iterationDescription	= "Test iteration " + de::toString(m_iteration+1) + " / " + de::toString(m_iterationCount);
	const tcu::ScopedLogSection						section					(m_context.getTestContext().getLog(), "Iteration" + de::toString(m_iteration+1), iterationDescription);
	tcu::Surface									resultImage				(m_renderSize, m_renderSize);
	std::vector<tcu::Vec4>							drawBuffer;
	std::vector<tcu::Vec4>							colorBuffer;
	std::vector<TriangleSceneSpec::SceneTriangle>	triangles;

	// generate scene
	generateVertices(m_iteration, drawBuffer, colorBuffer);
	extractTriangles(triangles, drawBuffer, colorBuffer);

	// log
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Generated vertices:" << tcu::TestLog::EndMessage;
		for (int vtxNdx = 0; vtxNdx < (int)drawBuffer.size(); ++vtxNdx)
			m_context.getTestContext().getLog() << tcu::TestLog::Message << "\t" << drawBuffer[vtxNdx] << ",\tcolor= " << colorBuffer[vtxNdx] << tcu::TestLog::EndMessage;
	}

	// draw image
	drawPrimitives(resultImage, drawBuffer, colorBuffer, m_primitiveTopology);

	// compare
	{
		RasterizationArguments	args;
		TriangleSceneSpec		scene;
		tcu::IVec4				colorBits	= tcu::getTextureFormatBitDepth(getTextureFormat());

		args.numSamples		= m_multisampling ? 1 : 0;
		args.subpixelBits	= m_subpixelBits;
		args.redBits		= colorBits[0];
		args.greenBits		= colorBits[1];
		args.blueBits		= colorBits[2];

		scene.triangles.swap(triangles);

		if (!verifyTriangleGroupInterpolation(resultImage, scene, args, m_context.getTestContext().getLog()))
			m_allIterationsPassed = false;
	}

	// result
	if (++m_iteration == m_iterationCount)
	{
		if (m_allIterationsPassed)
			return tcu::TestStatus::pass("Pass");
		else
			return tcu::TestStatus::fail("Found invalid pixel values");
	}
	else
		return tcu::TestStatus::incomplete();
}